

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O1

CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> * __thiscall
protozero::CopyablePtr<perfetto::protos::gen::BeginFrameObserverState>::operator=
          (CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *this,
          CopyablePtr<perfetto::protos::gen::BeginFrameObserverState> *other)

{
  _Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false> _Var2;
  
  _Var1._M_head_impl =
       (other->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
       .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (this->ptr_)._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::BeginFrameObserverState,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_std::default_delete<perfetto::protos::gen::BeginFrameObserverState>_>
       .super__Head_base<0UL,_perfetto::protos::gen::BeginFrameObserverState_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->dropped_begin_frame_args_ = (_Var1._M_head_impl)->dropped_begin_frame_args_;
  perfetto::protos::gen::BeginFrameArgs::operator=
            ((BeginFrameArgs *)((_Var2._M_head_impl)->last_begin_frame_args_).ptr_,
             (BeginFrameArgs *)((_Var1._M_head_impl)->last_begin_frame_args_).ptr_);
  std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

CopyablePtr& operator=(const CopyablePtr& other) {
    *ptr_ = *other.ptr_;
    return *this;
  }